

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_histogram<long,_(unsigned_char)'\x02'>::~basic_dynamic_histogram
          (basic_dynamic_histogram<long,_(unsigned_char)__x02_> *this)

{
  basic_dynamic_histogram<long,_(unsigned_char)__x02_> *in_RDI;
  
  ~basic_dynamic_histogram(in_RDI);
  operator_delete(in_RDI,0xf8);
  return;
}

Assistant:

basic_dynamic_histogram(std::string name, std::string help,
                          std::vector<double> buckets,
                          std::array<std::string, N> labels_name)
      : bucket_boundaries_(buckets),
        dynamic_metric(MetricType::Histogram, name, help, labels_name),
        sum_(std::make_shared<basic_dynamic_gauge<value_type, N>>(
            name, help, labels_name)) {
    for (size_t i = 0; i < buckets.size() + 1; i++) {
      bucket_counts_.push_back(
          std::make_shared<basic_dynamic_counter<value_type, N>>(name, help,
                                                                 labels_name));
    }
  }